

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresstype.h
# Opt level: O0

bool operator<(WitnessUnknown *w1,WitnessUnknown *w2)

{
  long lVar1;
  __synth3way_t<unsigned_char> _Var2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  long in_FS_OFFSET;
  WitnessUnknown *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined1 local_a;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = WitnessUnknown::GetWitnessVersion(in_stack_ffffffffffffffb8);
  uVar4 = WitnessUnknown::GetWitnessVersion(in_stack_ffffffffffffffb8);
  if (uVar3 < uVar4) {
    local_a = true;
  }
  else {
    uVar4 = WitnessUnknown::GetWitnessVersion(in_stack_ffffffffffffffb8);
    uVar5 = WitnessUnknown::GetWitnessVersion(in_stack_ffffffffffffffb8);
    if (uVar5 < uVar4) {
      local_a = false;
    }
    else {
      WitnessUnknown::GetWitnessProgram(in_stack_ffffffffffffffb8);
      WitnessUnknown::GetWitnessProgram(in_stack_ffffffffffffffb8);
      _Var2 = std::operator<=><unsigned_char,std::allocator<unsigned_char>>
                        (in_RSI,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                CONCAT44(in_stack_ffffffffffffffdc,uVar3));
      std::__cmp_cat::__unspec::__unspec((__unspec *)in_stack_ffffffffffffffb8,(__unspec *)0x98207a)
      ;
      local_a = std::operator<(_Var2._M_value);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_a;
  }
  __stack_chk_fail();
}

Assistant:

bool operator<(const WitnessUnknown& w1, const WitnessUnknown& w2) {
        if (w1.GetWitnessVersion() < w2.GetWitnessVersion()) return true;
        if (w1.GetWitnessVersion() > w2.GetWitnessVersion()) return false;
        return w1.GetWitnessProgram() < w2.GetWitnessProgram();
    }